

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ddict.c
# Opt level: O1

void ZSTD_copyDDictParameters(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  void *pvVar1;
  
  if (dctx == (ZSTD_DCtx *)0x0) {
    __assert_fail("dctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_ddict.c"
                  ,0x3d,"void ZSTD_copyDDictParameters(ZSTD_DCtx *, const ZSTD_DDict *)");
  }
  if (ddict != (ZSTD_DDict *)0x0) {
    dctx->dictID = ddict->dictID;
    pvVar1 = ddict->dictContent;
    dctx->prefixStart = pvVar1;
    dctx->virtualStart = pvVar1;
    pvVar1 = (void *)((long)pvVar1 + ddict->dictSize);
    dctx->dictEnd = pvVar1;
    dctx->previousDstEnd = pvVar1;
    if (ddict->entropyPresent == 0) {
      dctx->litEntropy = 0;
      dctx->fseEntropy = 0;
    }
    else {
      dctx->litEntropy = 1;
      dctx->fseEntropy = 1;
      dctx->LLTptr = (ddict->entropy).LLTable;
      dctx->MLTptr = (ddict->entropy).MLTable;
      dctx->OFTptr = (ddict->entropy).OFTable;
      dctx->HUFptr = (ddict->entropy).hufTable;
      (dctx->entropy).rep[0] = (ddict->entropy).rep[0];
      (dctx->entropy).rep[1] = (ddict->entropy).rep[1];
      (dctx->entropy).rep[2] = (ddict->entropy).rep[2];
    }
    return;
  }
  __assert_fail("ddict != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_ddict.c"
                ,0x3e,"void ZSTD_copyDDictParameters(ZSTD_DCtx *, const ZSTD_DDict *)");
}

Assistant:

void ZSTD_copyDDictParameters(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    DEBUGLOG(4, "ZSTD_copyDDictParameters");
    assert(dctx != NULL);
    assert(ddict != NULL);
    dctx->dictID = ddict->dictID;
    dctx->prefixStart = ddict->dictContent;
    dctx->virtualStart = ddict->dictContent;
    dctx->dictEnd = (const BYTE*)ddict->dictContent + ddict->dictSize;
    dctx->previousDstEnd = dctx->dictEnd;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    dctx->dictContentBeginForFuzzing = dctx->prefixStart;
    dctx->dictContentEndForFuzzing = dctx->previousDstEnd;
#endif
    if (ddict->entropyPresent) {
        dctx->litEntropy = 1;
        dctx->fseEntropy = 1;
        dctx->LLTptr = ddict->entropy.LLTable;
        dctx->MLTptr = ddict->entropy.MLTable;
        dctx->OFTptr = ddict->entropy.OFTable;
        dctx->HUFptr = ddict->entropy.hufTable;
        dctx->entropy.rep[0] = ddict->entropy.rep[0];
        dctx->entropy.rep[1] = ddict->entropy.rep[1];
        dctx->entropy.rep[2] = ddict->entropy.rep[2];
    } else {
        dctx->litEntropy = 0;
        dctx->fseEntropy = 0;
    }
}